

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O0

bool uWS::WebSocketContext<true,_true>::setCompressed(WebSocketState<true> *wState,void *s)

{
  long lVar1;
  undefined8 in_RSI;
  bool bVar2;
  WebSocketData *webSocketData;
  
  lVar1 = us_socket_ext(1,in_RSI);
  bVar2 = *(char *)(lVar1 + 0x5d) == '\x01';
  if (bVar2) {
    *(undefined1 *)(lVar1 + 0x5d) = 2;
  }
  return bVar2;
}

Assistant:

static bool setCompressed(uWS::WebSocketState<isServer> *wState, void *s) {
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) s);

        if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::ENABLED) {
            webSocketData->compressionStatus = WebSocketData::CompressionStatus::COMPRESSED_FRAME;
            return true;
        } else {
            return false;
        }
    }